

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void * resizebox(lua_State *L,int idx,size_t newsize)

{
  lua_Alloc p_Var1;
  void *temp;
  lua_Alloc allocf;
  void *ud;
  UBox *box;
  size_t newsize_local;
  lua_State *plStack_18;
  int idx_local;
  lua_State *L_local;
  
  box = (UBox *)newsize;
  newsize_local._4_4_ = idx;
  plStack_18 = L;
  ud = lua_touserdata(L,idx);
  if (*(UBox **)((long)ud + 8) == box) {
    L_local = *ud;
  }
  else {
    p_Var1 = lua_getallocf(plStack_18,&allocf);
    L_local = (lua_State *)(*p_Var1)(allocf,*ud,*(size_t *)((long)ud + 8),(size_t)box);
    if (L_local == (lua_State *)0x0 && box != (UBox *)0x0) {
      lua_pushstring(plStack_18,"not enough memory");
      lua_error(plStack_18);
    }
    *(lua_State **)ud = L_local;
    *(UBox **)((long)ud + 8) = box;
  }
  return L_local;
}

Assistant:

static void *resizebox (lua_State *L, int idx, size_t newsize) {
  UBox *box = (UBox *)lua_touserdata(L, idx);
  if (box->bsize == newsize)  /* not changing size? */
    return box->box;  /* keep the buffer */
  else {
    void *ud;
    lua_Alloc allocf = lua_getallocf(L, &ud);
    void *temp = allocf(ud, box->box, box->bsize, newsize);
    if (l_unlikely(temp == NULL && newsize > 0)) {  /* allocation error? */
      lua_pushliteral(L, "not enough memory");
      lua_error(L);  /* raise a memory error */
    }
    box->box = temp;
    box->bsize = newsize;
    return temp;
  }
}